

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char16_t * __thiscall kj::Vector<char16_t>::add<char16_t&>(Vector<char16_t> *this,char16_t *params)

{
  bool bVar1;
  char16_t *pcVar2;
  char16_t *params_local;
  Vector<char16_t> *this_local;
  
  bVar1 = ArrayBuilder<char16_t>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pcVar2 = fwd<char16_t&>(params);
  pcVar2 = ArrayBuilder<char16_t>::add<char16_t&>(&this->builder,pcVar2);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }